

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err nni_http_req_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  size_t line_00;
  nng_err nVar1;
  nni_http_req *pnVar2;
  uint8_t *line;
  nni_http_req *req;
  size_t sStack_38;
  int rv;
  size_t cnt;
  size_t len;
  size_t *lenp_local;
  size_t n_local;
  void *buf_local;
  nng_http *conn_local;
  
  cnt = 0;
  len = (size_t)lenp;
  lenp_local = (size_t *)n;
  n_local = (size_t)buf;
  buf_local = conn;
  pnVar2 = nni_http_conn_req(conn);
  while (nVar1 = http_scan_line((void *)n_local,(size_t)lenp_local,&stack0xffffffffffffffc8),
        line_00 = n_local, nVar1 == NNG_OK) {
    cnt = sStack_38 + cnt;
    lenp_local = (size_t *)((long)lenp_local - sStack_38);
    if (*(char *)n_local == '\0') break;
    if (((pnVar2->data).parsed & 1U) == 0) {
      (pnVar2->data).parsed = true;
      n_local = n_local + sStack_38;
      http_req_parse_line((nng_http *)buf_local,(void *)line_00);
    }
    else {
      n_local = n_local + sStack_38;
      http_parse_header((nng_http *)buf_local,(void *)line_00);
    }
  }
  if (nVar1 != NNG_EAGAIN) {
    (pnVar2->data).parsed = false;
  }
  *(size_t *)len = cnt;
  return nVar1;
}

Assistant:

nng_err
nni_http_req_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nni_http_req *req = nni_http_conn_req(conn);

	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (req->data.parsed) {
			rv = http_parse_header(conn, line);
		} else {
			req->data.parsed = true;
			rv               = http_req_parse_line(conn, line);
		}
	}

	if (rv != NNG_EAGAIN) {
		req->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}